

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O2

void __thiscall
sptk::GaussianMixtureModeling::GaussianMixtureModeling
          (GaussianMixtureModeling *this,int num_order,int num_mixture,int num_iteration,
          double convergence_threshold,CovarianceType covariance_type,
          vector<int,_std::allocator<int>_> *block_size,double weight_floor,double variance_floor,
          InitializationType initialization_type,int log_interval,double smoothing_parameter,
          vector<double,_std::allocator<double>_> *ubm_weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *ubm_mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
          *ubm_covariance_matrices)

{
  SymmetricMatrix *this_00;
  double dVar1;
  pointer piVar2;
  double *pdVar3;
  bool bVar4;
  int *piVar5;
  double *pdVar6;
  int iVar7;
  pointer pdVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int num_dimension;
  vector<int,_std::allocator<int>_> *this_01;
  int m;
  int column;
  int col;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> offset;
  Row local_a0;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  double local_60;
  _Vector_base<int,_std::allocator<int>_> local_58;
  ulong local_40;
  ulong local_38;
  
  this->_vptr_GaussianMixtureModeling = (_func_int **)&PTR__GaussianMixtureModeling_0011eb20;
  this->num_order_ = num_order;
  this->num_mixture_ = num_mixture;
  this->num_iteration_ = num_iteration;
  this->convergence_threshold_ = convergence_threshold;
  this->covariance_type_ = covariance_type;
  this_01 = &this->block_size_;
  local_84 = num_mixture;
  local_60 = smoothing_parameter;
  std::vector<int,_std::allocator<int>_>::vector(this_01,block_size);
  this->weight_floor_ = weight_floor;
  this->variance_floor_ = variance_floor;
  this->initialization_type_ = initialization_type;
  this->log_interval_ = log_interval;
  this->smoothing_parameter_ = local_60;
  std::vector<double,_std::allocator<double>_>::vector(&this->ubm_weights_,ubm_weights);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->ubm_mean_vectors_,ubm_mean_vectors);
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
            (&this->ubm_covariance_matrices_,ubm_covariance_matrices);
  if (this->covariance_type_ == kDiagonal) {
    bVar4 = (long)(this->block_size_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->block_size_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start == 4;
  }
  else {
    bVar4 = false;
  }
  this->is_diagonal_ = bVar4;
  this->is_valid_ = true;
  this_00 = &this->mask_;
  SymmetricMatrix::SymmetricMatrix(this_00,0);
  (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if ((-1 < this->num_order_) && (0 < this->num_mixture_)) {
    if (this->initialization_type_ == kKMeans) {
      bVar4 = IsPowerOfTwo(this->num_mixture_);
      if (!bVar4 || this->num_iteration_ < 1) goto LAB_00107494;
    }
    else if (this->num_iteration_ < 1) goto LAB_00107494;
    if (((((0.0 < this->convergence_threshold_ || this->convergence_threshold_ == 0.0) &&
          (0.0 <= this->weight_floor_)) && (this->weight_floor_ <= 1.0 / (double)this->num_mixture_)
         ) && ((0 < log_interval && (0.0 < this->variance_floor_ || this->variance_floor_ == 0.0))))
       && ((0.0 <= this->smoothing_parameter_ && (this->smoothing_parameter_ <= 1.0)))) {
      num_dimension = this->num_order_ + 1;
      iVar7 = 0;
      for (piVar5 = (block_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          piVar5 != (block_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
        if (*piVar5 < 1) goto LAB_00107494;
        iVar7 = iVar7 + *piVar5;
      }
      if (iVar7 == num_dimension) {
        uVar10 = (long)(this->block_size_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->block_size_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_58,
                   (long)(uVar10 * 0x40000000 + 0x100000000) >> 0x20,(allocator_type *)&local_a0);
        std::
        partial_sum<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (this->block_size_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (this->block_size_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (local_58._M_impl.super__Vector_impl_data._M_start + 1));
        local_70 = &this->ubm_mean_vectors_;
        local_68 = &this->ubm_weights_;
        SymmetricMatrix::Resize(this_00,num_dimension);
        SymmetricMatrix::Fill(this_00,1.0);
        uVar10 = uVar10 >> 2;
        uVar12 = 0;
        local_40 = 0;
        if (0 < (int)uVar10) {
          local_40 = uVar10 & 0xffffffff;
        }
        local_38 = uVar10 & 0xffffffff;
        for (; uVar12 != local_40; uVar12 = uVar12 + 1) {
          local_80 = local_58._M_impl.super__Vector_impl_data._M_start[uVar12];
          local_7c = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar12] + local_80;
          for (uVar10 = 0; uVar10 != local_38; uVar10 = uVar10 + 1) {
            local_74 = local_58._M_impl.super__Vector_impl_data._M_start[uVar10];
            iVar9 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar10] + local_74;
            local_78 = -local_74;
            for (iVar7 = local_80; iVar11 = local_78, column = local_74, iVar7 < local_7c;
                iVar7 = iVar7 + 1) {
              for (; column < iVar9; column = column + 1) {
                if (this->covariance_type_ == kFull) {
                  if (uVar12 != uVar10) {
                    local_a0._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
                    local_a0.matrix_ = this_00;
                    local_a0.row_ = iVar7;
                    pdVar6 = SymmetricMatrix::Row::operator[](&local_a0,column);
                    goto LAB_001076d4;
                  }
                }
                else if (this->covariance_type_ == kDiagonal) {
                  piVar2 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  if (piVar2[uVar12] == piVar2[uVar10]) {
                    if (local_58._M_impl.super__Vector_impl_data._M_start[uVar10 + 1] + iVar11 ==
                        local_58._M_impl.super__Vector_impl_data._M_start[uVar12 + 1] - iVar7)
                    goto LAB_001076e2;
                    local_a0._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
                    local_a0.matrix_ = this_00;
                    local_a0.row_ = iVar7;
                    pdVar6 = SymmetricMatrix::Row::operator[](&local_a0,column);
                  }
                  else {
                    local_a0._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
                    local_a0.matrix_ = this_00;
                    local_a0.row_ = iVar7;
                    pdVar6 = SymmetricMatrix::Row::operator[](&local_a0,column);
                  }
LAB_001076d4:
                  *pdVar6 = 0.0;
                }
LAB_001076e2:
                iVar11 = iVar11 + -1;
              }
            }
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
        dVar1 = this->smoothing_parameter_;
        if (((this->initialization_type_ != kUbm) && (dVar1 <= 0.0)) ||
           (bVar4 = anon_unknown.dwarf_1e2fa::CheckGmm
                              (local_84,num_dimension,ubm_weights,ubm_mean_vectors,
                               ubm_covariance_matrices), bVar4)) {
          if (dVar1 <= 0.0) {
            return;
          }
          std::vector<double,_std::allocator<double>_>::resize(&this->xi_,(long)this->num_mixture_);
          pdVar3 = (ubm_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pdVar8 = (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (pdVar6 = (ubm_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start; pdVar6 != pdVar3; pdVar6 = pdVar6 + 1) {
            *pdVar8 = *pdVar6 * local_60;
            pdVar8 = pdVar8 + 1;
          }
          return;
        }
      }
    }
  }
LAB_00107494:
  this->is_valid_ = false;
  return;
}

Assistant:

GaussianMixtureModeling::GaussianMixtureModeling(
    int num_order, int num_mixture, int num_iteration,
    double convergence_threshold, CovarianceType covariance_type,
    std::vector<int> block_size, double weight_floor, double variance_floor,
    InitializationType initialization_type, int log_interval,
    double smoothing_parameter, const std::vector<double>& ubm_weights,
    const std::vector<std::vector<double> >& ubm_mean_vectors,
    const std::vector<SymmetricMatrix>& ubm_covariance_matrices)
    : num_order_(num_order),
      num_mixture_(num_mixture),
      num_iteration_(num_iteration),
      convergence_threshold_(convergence_threshold),
      covariance_type_(covariance_type),
      block_size_(block_size),
      weight_floor_(weight_floor),
      variance_floor_(variance_floor),
      initialization_type_(initialization_type),
      log_interval_(log_interval),
      smoothing_parameter_(smoothing_parameter),
      ubm_weights_(ubm_weights),
      ubm_mean_vectors_(ubm_mean_vectors),
      ubm_covariance_matrices_(ubm_covariance_matrices),
      is_diagonal_(kDiagonal == covariance_type_ && 1 == block_size_.size()),
      is_valid_(true) {
  if (num_order_ < 0 || num_mixture_ <= 0 ||
      (kKMeans == initialization_type_ && !sptk::IsPowerOfTwo(num_mixture_)) ||
      num_iteration_ <= 0 || convergence_threshold_ < 0.0 ||
      weight_floor_ < 0.0 || 1.0 / num_mixture_ < weight_floor_ ||
      variance_floor_ < 0.0 || log_interval <= 0 ||
      smoothing_parameter_ < 0.0 || 1.0 < smoothing_parameter_) {
    is_valid_ = false;
    return;
  }

  const int length(num_order_ + 1);

  // Check block size.
  {
    int sum(0);
    for (int b : block_size) {
      if (b <= 0) {
        is_valid_ = false;
        return;
      }
      sum += b;
    }
    if (sum != length) {
      is_valid_ = false;
      return;
    }
  }

  // Create mask of covariance.
  {
    const int num_block(static_cast<int>(block_size_.size()));
    std::vector<int> offset(num_block + 1);
    std::partial_sum(block_size_.begin(), block_size_.end(),
                     offset.begin() + 1);

    mask_.Resize(length);
    mask_.Fill(1.0);
    for (int row(0); row < num_block; ++row) {
      const int begin_l(offset[row]);
      const int end_l(offset[row] + block_size_[row]);
      for (int col(0); col < num_block; ++col) {
        const int begin_m(offset[col]);
        const int end_m(offset[col] + block_size_[col]);
        for (int l(begin_l); l < end_l; ++l) {
          for (int m(begin_m); m < end_m; ++m) {
            if (kDiagonal == covariance_type_) {
              if (block_size_[row] != block_size_[col]) {
                mask_[l][m] = 0.0;
              } else if (offset[row + 1] - l != offset[col + 1] - m) {
                mask_[l][m] = 0.0;
              }
            } else if (kFull == covariance_type_) {
              if (row != col) {
                mask_[l][m] = 0.0;
              }
            }
          }
        }
      }
    }
  }

  // Check the sanity of universal background model.
  if (kUbm == initialization_type_ || 0.0 < smoothing_parameter_) {
    if (!CheckGmm(num_mixture, length, ubm_weights, ubm_mean_vectors,
                  ubm_covariance_matrices)) {
      is_valid_ = false;
      return;
    }
  }

  if (0.0 < smoothing_parameter_) {
    xi_.resize(num_mixture_);
    std::transform(
        ubm_weights.begin(), ubm_weights.end(), xi_.begin(),
        [smoothing_parameter](double w) { return smoothing_parameter * w; });
  }
}